

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crail_outputstream.cc
# Opt level: O0

Future<int> * __thiscall
CrailOutputstream::Write(CrailOutputstream *this,shared_ptr<crail::ByteBuffer> *buf)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  ostream *this_00;
  element_type *peVar5;
  void *this_01;
  element_type *peVar6;
  unsigned_long_long uVar7;
  unsigned_long_long uVar8;
  BlockInfo *offset;
  element_type *peVar9;
  element_type *peVar10;
  long in_RSI;
  Future<int> *in_RDI;
  longlong block_addr;
  shared_ptr<StorageClient> storage_client;
  int port;
  int address;
  GetblockResponse get_block_res;
  BlockInfo *block_info;
  int buf_original_limit;
  int block_remaining;
  int block_offset;
  Future<int> *storage_response;
  undefined4 in_stack_fffffffffffffd18;
  int in_stack_fffffffffffffd1c;
  undefined4 in_stack_fffffffffffffd20;
  undefined4 in_stack_fffffffffffffd24;
  undefined4 in_stack_fffffffffffffd30;
  undefined4 in_stack_fffffffffffffd34;
  BlockCache *in_stack_fffffffffffffd38;
  long lVar11;
  Future<GetblockResponse> *in_stack_fffffffffffffd98;
  BlockInfo *block;
  undefined4 in_stack_fffffffffffffdb0;
  DatanodeInfo *in_stack_fffffffffffffdd0;
  StorageCache *in_stack_fffffffffffffdd8;
  undefined1 local_1f0 [23];
  undefined1 local_1d9;
  long local_1d8;
  DatanodeInfo local_1d0;
  DatanodeInfo local_1a0;
  int local_17c;
  DatanodeInfo local_178;
  int local_154;
  BlockInfo local_150;
  uint local_110;
  DatanodeInfo local_100 [3];
  GetblockResponse local_88;
  BlockInfo *local_30;
  int local_24;
  int local_20;
  uint local_1c;
  
  this_00 = std::operator<<((ostream *)&std::cout,"CrailOutputstream::Write buf->remaining ");
  peVar5 = std::__shared_ptr_access<crail::ByteBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<crail::ByteBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x15f5d2);
  iVar2 = crail::ByteBuffer::remaining(peVar5);
  this_01 = (void *)std::ostream::operator<<(this_00,iVar2);
  std::ostream::operator<<(this_01,std::endl<char,std::char_traits<char>>);
  peVar5 = std::__shared_ptr_access<crail::ByteBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<crail::ByteBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x15f605);
  iVar2 = crail::ByteBuffer::remaining(peVar5);
  if (iVar2 < 0) {
    Future<int>::Failure(in_stack_fffffffffffffd1c);
  }
  else {
    peVar5 = std::__shared_ptr_access<crail::ByteBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<crail::ByteBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x15f636);
    iVar2 = crail::ByteBuffer::remaining(peVar5);
    if (iVar2 == 0) {
      Future<int>::Failure(in_stack_fffffffffffffd1c);
    }
    else {
      local_1c = (uint)*(undefined8 *)(in_RSI + 0x70) & 0xfffff;
      local_20 = 0x100000 - local_1c;
      peVar5 = std::__shared_ptr_access<crail::ByteBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<crail::ByteBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x15f693);
      local_24 = crail::ByteBuffer::limit(peVar5);
      iVar2 = local_20;
      peVar5 = std::__shared_ptr_access<crail::ByteBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<crail::ByteBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x15f6bd);
      iVar3 = crail::ByteBuffer::remaining(peVar5);
      if (iVar2 < iVar3) {
        in_stack_fffffffffffffdd8 =
             (StorageCache *)
             std::__shared_ptr_access<crail::ByteBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<crail::ByteBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x15f6df);
        peVar5 = std::
                 __shared_ptr_access<crail::ByteBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<crail::ByteBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x15f6f4);
        iVar2 = crail::ByteBuffer::position(peVar5);
        crail::ByteBuffer::set_limit((ByteBuffer *)in_stack_fffffffffffffdd8,iVar2 + local_20);
      }
      std::__shared_ptr_access<BlockCache,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<BlockCache,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x15f723);
      local_30 = BlockCache::GetBlock
                           (in_stack_fffffffffffffd38,
                            CONCAT44(in_stack_fffffffffffffd34,in_stack_fffffffffffffd30));
      bVar1 = BlockInfo::valid((BlockInfo *)0x15f74c);
      if (!bVar1) {
        peVar6 = std::__shared_ptr_access<NamenodeClient,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<NamenodeClient,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x15f765);
        uVar7 = FileInfo::fd((FileInfo *)(in_RSI + 8));
        uVar8 = FileInfo::token((FileInfo *)(in_RSI + 8));
        in_stack_fffffffffffffdd0 = local_100;
        (*peVar6->_vptr_NamenodeClient[4])
                  (in_stack_fffffffffffffdd0,peVar6,uVar7,uVar8,*(undefined8 *)(in_RSI + 0x70));
        Future<GetblockResponse>::get(in_stack_fffffffffffffd98);
        Future<GetblockResponse>::~Future
                  ((Future<GetblockResponse> *)
                   CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20));
        iVar2 = NamenodeResponse::error(&local_88.super_NamenodeResponse);
        bVar1 = -1 < iVar2;
        if (bVar1) {
          offset = GetblockResponse::block_info(&local_88);
          BlockInfo::operator=
                    ((BlockInfo *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
                     (BlockInfo *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
          std::__shared_ptr_access<BlockCache,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                    ((__shared_ptr_access<BlockCache,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                     0x15f8be);
          block = &local_150;
          BlockInfo::BlockInfo
                    ((BlockInfo *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
                     (BlockInfo *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
          BlockCache::PutBlock
                    ((BlockCache *)CONCAT44(iVar2,in_stack_fffffffffffffdb0),(longlong)offset,block)
          ;
          BlockInfo::~BlockInfo((BlockInfo *)0x15f920);
        }
        else {
          Future<int>::Failure(in_stack_fffffffffffffd1c);
        }
        local_110 = (uint)!bVar1;
        GetblockResponse::~GetblockResponse
                  ((GetblockResponse *)CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20)
                  );
        if (local_110 != 0) {
          return in_RDI;
        }
      }
      peVar5 = std::__shared_ptr_access<crail::ByteBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<crail::ByteBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x15f98c);
      iVar2 = crail::ByteBuffer::remaining(peVar5);
      *(long *)(in_RSI + 0x70) = *(long *)(in_RSI + 0x70) + (long)iVar2;
      BlockInfo::datanode((BlockInfo *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18)
                         );
      iVar2 = DatanodeInfo::addr(&local_178);
      DatanodeInfo::~DatanodeInfo(&local_178);
      local_154 = iVar2;
      BlockInfo::datanode((BlockInfo *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18)
                         );
      iVar2 = DatanodeInfo::port(&local_1a0);
      DatanodeInfo::~DatanodeInfo(&local_1a0);
      local_17c = iVar2;
      std::__shared_ptr_access<StorageCache,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
                ((__shared_ptr_access<StorageCache,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                 0x15fa41);
      BlockInfo::datanode((BlockInfo *)CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18)
                         );
      StorageCache::Get(in_stack_fffffffffffffdd8,in_stack_fffffffffffffdd0);
      DatanodeInfo::~DatanodeInfo(&local_1d0);
      uVar7 = BlockInfo::addr(local_30);
      local_1d8 = uVar7 + (long)(int)local_1c;
      local_1d9 = 0;
      peVar9 = std::__shared_ptr_access<StorageClient,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<StorageClient,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x15fac7);
      uVar4 = BlockInfo::lkey(local_30);
      lVar11 = local_1d8;
      std::shared_ptr<crail::ByteBuffer>::shared_ptr
                ((shared_ptr<crail::ByteBuffer> *)
                 CONCAT44(in_stack_fffffffffffffd24,in_stack_fffffffffffffd20),
                 (shared_ptr<crail::ByteBuffer> *)
                 CONCAT44(in_stack_fffffffffffffd1c,in_stack_fffffffffffffd18));
      (*peVar9->_vptr_StorageClient[2])(in_RDI,peVar9,(ulong)uVar4,lVar11,local_1f0);
      std::shared_ptr<crail::ByteBuffer>::~shared_ptr((shared_ptr<crail::ByteBuffer> *)0x15fb39);
      peVar5 = std::__shared_ptr_access<crail::ByteBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<crail::ByteBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x15fb46);
      peVar10 = std::
                __shared_ptr_access<crail::ByteBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<crail::ByteBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x15fb58);
      iVar2 = crail::ByteBuffer::position(peVar10);
      peVar10 = std::
                __shared_ptr_access<crail::ByteBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<crail::ByteBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x15fb73);
      iVar3 = crail::ByteBuffer::remaining(peVar10);
      crail::ByteBuffer::set_position(peVar5,iVar2 + iVar3);
      peVar5 = std::__shared_ptr_access<crail::ByteBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<crail::ByteBuffer,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x15fba4);
      crail::ByteBuffer::set_limit(peVar5,local_24);
      local_110 = 1;
      local_1d9 = 1;
      std::shared_ptr<StorageClient>::~shared_ptr((shared_ptr<StorageClient> *)0x15fcc3);
    }
  }
  return in_RDI;
}

Assistant:

Future<int> CrailOutputstream::Write(shared_ptr<ByteBuffer> buf) {
  cout << "CrailOutputstream::Write buf->remaining " << buf->remaining()
       << endl;
  if (buf->remaining() < 0) {
    return Future<int>::Failure(-1);
  }
  if (buf->remaining() == 0) {
    return Future<int>::Failure(-1);
  }

  int block_offset = position_ % kBlockSize;
  int block_remaining = kBlockSize - block_offset;
  int buf_original_limit = buf->limit();

  if (block_remaining < buf->remaining()) {
    buf->set_limit(buf->position() + block_remaining);
  }

  BlockInfo &block_info = block_cache_->GetBlock(position_);
  if (!block_info.valid()) {
    GetblockResponse get_block_res =
        namenode_client_
            ->GetBlock(file_info_.fd(), file_info_.token(), position_,
                       position_)
            .get();

    if (get_block_res.error() < 0) {
      return Future<int>::Failure(-1);
    }

    block_info = get_block_res.block_info();
    block_cache_->PutBlock(position_, block_info);
  }

  this->position_ += buf->remaining();
  int address = block_info.datanode().addr();
  int port = block_info.datanode().port();

  shared_ptr<StorageClient> storage_client =
      storage_cache_->Get(block_info.datanode());
  long long block_addr = block_info.addr() + block_offset;
  Future<int> storage_response =
      storage_client->WriteData(block_info.lkey(), block_addr, buf);

  buf->set_position(buf->position() + buf->remaining());
  buf->set_limit(buf_original_limit);

  return storage_response;
}